

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_Backward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  complex<double> **ppcVar1;
  double dVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  complex<double> *pcVar4;
  complex<double> *this_00;
  complex<double> *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  complex<double> *pcVar9;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  complex<double> local_48;
  
  lVar8 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar8 != CONCAT44(extraout_var,iVar3)) ||
     ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Subst_Backward(TPZFMatrix<TVar> *) const [TVar = std::complex<double>]"
               ,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
  }
  iVar3 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar3) != 0) {
    for (lVar8 = 0; lVar7 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol,
        lVar6 = CONCAT44(extraout_var_00,iVar3), lVar8 < lVar7; lVar8 = lVar8 + 1) {
      while (lVar7 = lVar6 + -1, 1 < lVar6) {
        pcVar4 = TPZFMatrix<std::complex<double>_>::operator()(B,lVar7,lVar8);
        if ((((*(double *)pcVar4->_M_value != 0.0) || (NAN(*(double *)pcVar4->_M_value))) ||
            (*(double *)(pcVar4->_M_value + 8) != 0.0)) ||
           (lVar6 = lVar7, NAN(*(double *)(pcVar4->_M_value + 8)))) break;
      }
      for (; 0 < lVar7; lVar7 = lVar7 + -1) {
        local_48._M_value._0_8_ = 0;
        local_48._M_value._8_8_ = 0;
        ppcVar1 = (this->fElem).fStore;
        pcVar4 = ppcVar1[lVar7];
        pcVar5 = ppcVar1[lVar7 + 1];
        this_00 = TPZFMatrix<std::complex<double>_>::operator()(B,lVar7,lVar8);
        std::complex<double>::operator/=(this_00,pcVar4);
        local_48._M_value._0_8_ = *(undefined8 *)this_00->_M_value;
        local_48._M_value._8_8_ = *(undefined8 *)(this_00->_M_value + 8);
        while( true ) {
          pcVar4 = pcVar4 + 1;
          pcVar9 = this_00 + -1;
          if (pcVar5 <= pcVar4) break;
          std::operator*(pcVar4,&local_48);
          dVar2 = *(double *)(this_00[-1]._M_value + 8);
          *(double *)pcVar9->_M_value = *(double *)pcVar9->_M_value - extraout_XMM0_Qa;
          *(double *)(this_00[-1]._M_value + 8) = dVar2 - in_XMM1_Qa;
          this_00 = pcVar9;
        }
      }
    }
    for (lVar8 = 0; lVar8 < lVar7; lVar8 = lVar8 + 1) {
      pcVar4 = *(this->fElem).fStore;
      pcVar5 = TPZFMatrix<std::complex<double>_>::operator()(B,0,lVar8);
      std::complex<double>::operator/=(pcVar5,pcVar4);
      lVar7 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Backward(B)");
#endif
    int64_t Dimension = this->Dim();
    if(!Dimension) return 1;	// nothing to do
    int64_t j;
    for ( j = 0; j < B->Cols(); j++ )
    {
        int64_t k = Dimension-1;
        while (k>0 && (*B)(k,j) == TVar(0.)) {
            k--;
        }
        //		std::cout << "kstart " << k << std::endl;
        
        for (;k > 0; k-- )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar val;
            TVar *elem_ki = fElem[k];
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            *BPtr /= *elem_ki++;
            val = *BPtr;
            //	BPtr;
            // substract the column of the skyline matrix from the vector.
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    for( j = 0; j< B->Cols(); j++) (*B)(0,j) /= fElem[0][0];
    return( 1 );
}